

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_list_equal(lyd_node *first,lyd_node *second,int action,int withdefaults,int log)

{
  LYS_NODE LVar1;
  lys_ext_instance **pplVar2;
  char *__s1;
  int iVar3;
  char *__string;
  LY_ERR *pLVar4;
  lyd_node *plVar5;
  lyd_node *plVar6;
  char *path;
  char *path_00;
  uint8_t *puVar7;
  size_t sVar8;
  lys_node *plVar9;
  lys_node *plVar10;
  uint8_t *puVar11;
  int iVar12;
  uint uVar13;
  undefined4 in_register_00000014;
  ulong uVar14;
  char *pcVar15;
  lys_ext *__s;
  lys_node *plVar16;
  uint8_t *__s_00;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  char *local_78;
  uint16_t local_52;
  uint8_t *puStack_50;
  uint16_t idx1;
  lys_node *local_48;
  uint16_t local_3e;
  int local_3c;
  uint16_t idx2;
  lys_node *plStack_38;
  
  local_48 = (lys_node *)CONCAT44(in_register_00000014,action);
  __string = ly_buf();
  if (first != (lyd_node *)0x0) {
    plVar16 = first->schema;
    LVar1 = plVar16->nodetype;
    if ((LVar1 & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) {
      if (second != (lyd_node *)0x0) {
        plVar9 = second->schema;
        if ((plVar9->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) {
          if (LVar1 != plVar9->nodetype) {
            __assert_fail("first->schema->nodetype == second->schema->nodetype",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                          ,0x143e,
                          "int lyd_list_equal(struct lyd_node *, struct lyd_node *, int, int, int)")
            ;
          }
          if (plVar16 != plVar9) {
            return 0;
          }
          if (LVar1 != LYS_LIST) {
            if (LVar1 != LYS_LEAFLIST) {
              pLVar4 = ly_errno_location();
              *pLVar4 = LY_EINT;
              ly_log(LY_LLERR,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                     ,0x14d3);
              return -1;
            }
            if (((plVar16->flags & 2) != 0) && ((plVar16->module->field_0x40 & 0xc) != 0)) {
              return 0;
            }
            if (first->child != second->child) {
              return 0;
            }
            if ((withdefaults != 0) && (((second->field_0x9 ^ first->field_0x9) & 1) != 0)) {
              return 0;
            }
            if (log != 0) {
              ly_vlog(LYE_DUPLEAFLIST,LY_VLOG_LYD,second,plVar9->name);
              return 1;
            }
            return 1;
          }
          iVar12 = (int)local_48;
          if (iVar12 != 0) {
            uVar13 = 0;
            plVar9 = local_48;
            local_3c = log;
            plStack_38 = plVar16;
            if (iVar12 < 1) goto LAB_0016393a;
            if ((int)(uint)plVar16->padding[3] < iVar12) goto LAB_0016393a;
            uVar13 = iVar12 - 1;
            do {
              puVar11 = (uint8_t *)(ulong)uVar13;
              pplVar2 = plVar16[1].ext;
              uVar17 = 0;
              if (*(char *)(pplVar2 + (long)puVar11 * 2 + 1) != '\0') {
                uVar18 = 0;
                puStack_50 = puVar11;
                do {
                  plVar5 = resolve_data_descendant_schema_nodeid
                                     ((char *)(&pplVar2[(long)puVar11 * 2]->def)[uVar18],
                                      first->child);
                  if (plVar5 == (lyd_node *)0x0) {
                    plVar5 = (lyd_node *)
                             lyd_get_unique_default
                                       ((char *)(&plStack_38[1].ext[(long)puVar11 * 2]->def)[uVar18]
                                        ,first);
                    pLVar4 = ly_errno_location();
                    if (*pLVar4 != LY_SUCCESS) {
                      return -1;
                    }
                  }
                  else {
                    plVar5 = plVar5->child;
                  }
                  plVar16 = plStack_38;
                  plVar6 = resolve_data_descendant_schema_nodeid
                                     ((char *)(&plStack_38[1].ext[(long)puVar11 * 2]->def)[uVar18],
                                      second->child);
                  if (plVar6 == (lyd_node *)0x0) {
                    plVar6 = (lyd_node *)
                             lyd_get_unique_default
                                       ((char *)(&plVar16[1].ext[(long)puVar11 * 2]->def)[uVar18],
                                        second);
                    pLVar4 = ly_errno_location();
                    if (*pLVar4 != LY_SUCCESS) {
                      return -1;
                    }
                  }
                  else {
                    plVar6 = plVar6->child;
                  }
                  if (((plVar5 == (lyd_node *)0x0) || (plVar6 == (lyd_node *)0x0)) ||
                     (plVar5 != plVar6)) break;
                  uVar18 = uVar18 + 1;
                  pplVar2 = plStack_38[1].ext;
                } while (uVar18 < *(byte *)(pplVar2 + (long)puVar11 * 2 + 1));
                uVar17 = (uint)uVar18;
                uVar13 = (uint)puStack_50;
                plVar9 = local_48;
                plVar16 = plStack_38;
              }
              if ((uVar17 != 0) && (uVar17 == *(byte *)(plVar16[1].ext + (long)puVar11 * 2 + 1))) {
                if (local_3c == 0) {
                  return 1;
                }
                path = (char *)malloc(0x400);
                path_00 = (char *)malloc(0x400);
                if (path == (char *)0x0 || path_00 == (char *)0x0) {
                  pLVar4 = ly_errno_location();
                  *pLVar4 = LY_EMEM;
                  ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_list_equal");
                  free(path);
                  free(path_00);
                  return -1;
                }
                local_3e = 0x3ff;
                local_52 = 0x3ff;
                path[0x3ff] = '\0';
                path_00[0x3ff] = '\0';
                ly_vlog_build_path_reverse(LY_VLOG_LYD,first,path,&local_52,0);
                ly_vlog_build_path_reverse(LY_VLOG_LYD,second,path_00,&local_3e,0);
                puVar7 = ly_buf_used_location();
                if ((*puVar7 == '\0') || (*__string == '\0')) {
                  local_78 = (char *)0x0;
                }
                else {
                  local_78 = strndup(__string,0x3ff);
                }
                puVar7 = ly_buf_used_location();
                *puVar7 = *puVar7 + '\x01';
                if (*(char *)(plStack_38[1].ext + (long)puVar11 * 2 + 1) != '\0') {
                  uVar18 = 0;
                  uVar14 = 0;
                  do {
                    if (uVar18 != 0) {
                      __string[uVar14 & 0xffff] = ' ';
                      uVar14 = (ulong)((int)uVar14 + 1);
                    }
                    __s = (&plStack_38[1].ext[(long)puVar11 * 2]->def)[uVar18];
                    local_48 = first->schema;
                    local_3c = 0;
                    do {
                      puVar7 = (uint8_t *)strchr((char *)__s,0x2f);
                      if (puVar7 == (uint8_t *)0x0) {
                        sVar8 = strlen((char *)__s);
                        puVar7 = __s->padding + (sVar8 - 0x1b);
                      }
                      puStack_50 = puVar7;
                      plVar9 = lys_getnext((lys_node *)0x0,local_48,(lys_module *)0x0,3);
                      bVar19 = plVar9 == (lys_node *)0x0;
                      puVar7 = puStack_50;
                      plVar16 = local_48;
                      if (!bVar19) {
                        sVar8 = (long)puStack_50 - (long)__s;
                        bVar19 = false;
                        do {
                          __s1 = plVar9->name;
                          iVar3 = strncmp(__s1,(char *)__s,sVar8);
                          iVar12 = local_3c;
                          if ((iVar3 == 0) && (__s1[sVar8] == '\0')) {
                            if (plVar9->nodetype == LYS_LIST) {
                              __assert_fail("snode->nodetype != LYS_LIST",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                                            ,0x1408,
                                            "int lyd_build_relative_data_path(const struct lyd_node *, const char *, char *)"
                                           );
                            }
                            if ((plVar9->nodetype & (LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN) {
                              pcVar15 = "/";
                              if (local_3c == 0) {
                                pcVar15 = "";
                              }
                              local_3c = sprintf(__string + (long)local_3c + (uVar14 & 0xffff),
                                                 "%s%s",pcVar15,__s1);
                              local_3c = local_3c + iVar12;
                            }
                            plVar10 = lys_parent(plVar9);
                            puVar7 = puStack_50;
                            plVar16 = plVar9;
                            if (((plVar10 != (lys_node *)0x0) &&
                                (plVar10 = lys_parent(plVar9), puVar7 = puStack_50,
                                plVar10->nodetype == LYS_CHOICE)) && (plVar9->nodetype != LYS_CASE))
                            {
                              __s_00 = puStack_50 + 1;
                              puVar7 = (uint8_t *)strchr((char *)__s_00,0x2f);
                              if (puVar7 == (uint8_t *)0x0) {
                                sVar8 = strlen((char *)__s_00);
                                puVar7 = __s_00 + sVar8;
                              }
                            }
                            break;
                          }
                          plVar9 = lys_getnext(plVar9,local_48,(lys_module *)0x0,3);
                          bVar19 = plVar9 == (lys_node *)0x0;
                          puVar7 = puStack_50;
                          plVar16 = local_48;
                        } while (!bVar19);
                      }
                      local_48 = plVar16;
                      if (bVar19) {
                        pLVar4 = ly_errno_location();
                        *pLVar4 = LY_EINT;
                        ly_log(LY_LLERR,"Internal error (%s:%d).",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                               ,0x1419);
                        iVar12 = 0xffff;
                        break;
                      }
                      __s = (lys_ext *)(puVar7 + 1);
                      iVar12 = local_3c;
                    } while (*puVar7 != '\0');
                    uVar14 = (ulong)(uint)((int)uVar14 + iVar12);
                    uVar18 = uVar18 + 1;
                  } while (uVar18 < *(byte *)(plStack_38[1].ext + (long)puVar11 * 2 + 1));
                }
                ly_vlog(LYE_NOUNIQ,LY_VLOG_LYD,second,__string,path + local_52,path_00 + local_3e);
                free(path);
                free(path_00);
                if (local_78 != (char *)0x0) {
                  strcpy(__string,local_78);
                  free(local_78);
                }
                puVar11 = ly_buf_used_location();
                *puVar11 = *puVar11 + 0xff;
                return 1;
              }
              if (0 < (int)plVar9) {
                return 0;
              }
              uVar13 = uVar13 + 1;
LAB_0016393a:
              log = local_3c;
            } while ((int)uVar13 < (int)(uint)plVar16->padding[3]);
          }
          if ((ulong)plVar16->padding[2] == 0) {
            return 0;
          }
          uVar18 = 0;
LAB_00163aa6:
          plVar9 = *(lys_node **)(*(long *)&plVar16[1].flags + uVar18 * 8);
          for (plVar5 = first->child; plVar6 = second->child, plVar5 != (lyd_node *)0x0;
              plVar5 = plVar5->next) {
            if (plVar5->schema == plVar9) {
              plVar5 = plVar5->child;
              goto joined_r0x00163acc;
            }
          }
          plVar5 = (lyd_node *)0x0;
joined_r0x00163acc:
          do {
            if (plVar6 == (lyd_node *)0x0) goto LAB_00163adf;
            if (plVar6->schema == plVar9) {
              plVar6 = plVar6->child;
              goto LAB_00163ae8;
            }
            plVar6 = plVar6->next;
          } while( true );
        }
      }
      __assert_fail("second && (second->schema->nodetype & (LYS_LIST | LYS_LEAFLIST))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                    ,0x143d,
                    "int lyd_list_equal(struct lyd_node *, struct lyd_node *, int, int, int)");
    }
  }
  __assert_fail("first && (first->schema->nodetype & (LYS_LIST | LYS_LEAFLIST))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                ,0x143c,"int lyd_list_equal(struct lyd_node *, struct lyd_node *, int, int, int)");
LAB_00163adf:
  plVar6 = (lyd_node *)0x0;
LAB_00163ae8:
  if (plVar5 != plVar6) {
    return 0;
  }
  uVar18 = uVar18 + 1;
  if (uVar18 == plVar16->padding[2]) {
    if (log != 0) {
      ly_vlog(LYE_DUPLIST,LY_VLOG_LYD,second,second->schema->name);
    }
    return 1;
  }
  goto LAB_00163aa6;
}

Assistant:

int
lyd_list_equal(struct lyd_node *first, struct lyd_node *second, int action, int withdefaults, int log)
{
    struct lys_node_list *slist;
    const struct lys_node *snode = NULL;
    struct lyd_node *diter;
    const char *val1, *val2;
    char *path1, *path2, *uniq_str = ly_buf(), *buf_backup = NULL;
    uint16_t idx1, idx2, idx_uniq;
    int i, j;

    assert(first && (first->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)));
    assert(second && (second->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)));
    assert(first->schema->nodetype == second->schema->nodetype);

    if (first->schema != second->schema) {
        return 0;
    }

    switch (first->schema->nodetype) {
    case LYS_LEAFLIST:
        if ((first->schema->flags & LYS_CONFIG_R) && first->schema->module->version >= 2) {
            /* same values are allowed for status data */
            return 0;
        }
        /* compare values */
        if (ly_strequal(((struct lyd_node_leaf_list *)first)->value_str,
                        ((struct lyd_node_leaf_list *)second)->value_str, 1)
                && (!withdefaults || (first->dflt == second->dflt))) {
            if (log) {
                LOGVAL(LYE_DUPLEAFLIST, LY_VLOG_LYD, second, second->schema->name,
                       ((struct lyd_node_leaf_list *)second)->value_str);
            }
            return 1;
        }
        return 0;
    case LYS_LIST:
        slist = (struct lys_node_list *)first->schema;

        /* compare unique leafs */
        if (action) {
            if (action > 0) {
                i = action - 1;
                if (i < slist->unique_size) {
                    goto uniquecheck;
                }
            }
            for (i = 0; i < slist->unique_size; i++) {
uniquecheck:
                for (j = 0; j < slist->unique[i].expr_size; j++) {
                    /* first */
                    diter = resolve_data_descendant_schema_nodeid(slist->unique[i].expr[j], first->child);
                    if (diter) {
                        val1 = ((struct lyd_node_leaf_list *)diter)->value_str;
                    } else {
                        /* use default value */
                        val1 = lyd_get_unique_default(slist->unique[i].expr[j], first);
                        if (ly_errno) {
                            return -1;
                        }
                    }

                    /* second */
                    diter = resolve_data_descendant_schema_nodeid(slist->unique[i].expr[j], second->child);
                    if (diter) {
                        val2 = ((struct lyd_node_leaf_list *)diter)->value_str;
                    } else {
                        /* use default value */
                        val2 = lyd_get_unique_default(slist->unique[i].expr[j], second);
                        if (ly_errno) {
                            return -1;
                        }
                    }

                    if (!val1 || !val2 || !ly_strequal(val1, val2, 1)) {
                        /* values differ */
                        break;
                    }
                }
                if (j && (j == slist->unique[i].expr_size)) {
                    /* all unique leafs are the same in this set, create this nice error */
                    if (!log) {
                        return 1;
                    }

                    path1 = malloc(LY_BUF_SIZE);
                    path2 = malloc(LY_BUF_SIZE);
                    if (!path1 || !path2) {
                        LOGMEM;
                        free(path1);
                        free(path2);
                        return -1;
                    }
                    idx1 = idx2 = LY_BUF_SIZE - 1;
                    path1[idx1] = '\0';
                    path2[idx2] = '\0';
                    ly_vlog_build_path_reverse(LY_VLOG_LYD, first, path1, &idx1, 0);
                    ly_vlog_build_path_reverse(LY_VLOG_LYD, second, path2, &idx2, 0);

                    /* use internal buffer to rebuild the unique string */
                    if (ly_buf_used && uniq_str[0]) {
                        buf_backup = strndup(uniq_str, LY_BUF_SIZE - 1);
                    }
                    ly_buf_used++;
                    idx_uniq = 0;

                    for (j = 0; j < slist->unique[i].expr_size; ++j) {
                        if (j) {
                            uniq_str[idx_uniq++] = ' ';
                        }
                        idx_uniq += lyd_build_relative_data_path(first, slist->unique[i].expr[j], &uniq_str[idx_uniq]);
                    }

                    LOGVAL(LYE_NOUNIQ, LY_VLOG_LYD, second, uniq_str, &path1[idx1], &path2[idx2]);
                    free(path1);
                    free(path2);
                    if (buf_backup) {
                        strcpy(uniq_str, buf_backup);
                        free(buf_backup);
                    }
                    ly_buf_used--;
                    return 1;
                }

                if (action > 0) {
                    /* done */
                    return 0;
                }
            }
        }

        /* compare keys */
        if (!slist->keys_size) {
            /* status lists without keys */
            return 0;
        } else {
            for (i = 0; i < slist->keys_size; i++) {
                snode = (struct lys_node *)slist->keys[i];
                val1 = val2 = NULL;
                LY_TREE_FOR(first->child, diter) {
                    if (diter->schema == snode) {
                        val1 = ((struct lyd_node_leaf_list *)diter)->value_str;
                        break;
                    }
                }
                LY_TREE_FOR(second->child, diter) {
                    if (diter->schema == snode) {
                        val2 = ((struct lyd_node_leaf_list *)diter)->value_str;
                        break;
                    }
                }
                if (!ly_strequal(val1, val2, 1)) {
                    return 0;
                }
            }
        }

        if (log) {
            LOGVAL(LYE_DUPLIST, LY_VLOG_LYD, second, second->schema->name);
        }
        return 1;
    default:
        LOGINT;
        return -1;
    }
}